

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

StringTree * __thiscall
capnp::JsonCodec::Impl::encodeRaw
          (StringTree *__return_storage_ptr__,Impl *this,Reader value,uint indent,bool *multiline,
          bool hasPrefix)

{
  int *__return_storage_ptr___00;
  uint uVar1;
  Which WVar2;
  uint uVar3;
  Array<kj::StringTree> *pAVar4;
  char (*params_00) [5];
  char *pcVar5;
  bool *params_3;
  StringPtr chars;
  uint local_35c;
  Fault local_358;
  Fault f;
  Array<kj::StringTree> local_348;
  StringTree local_330;
  undefined1 local_2f1;
  ArrayPtr<const_char> local_2f0;
  anon_class_24_3_b5b61ab8 local_2e0;
  Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&> local_2c8;
  undefined1 local_2c0 [8];
  Array<kj::StringTree> encodedElements_2;
  undefined1 local_2a0 [3];
  bool childMultiline_2;
  uint subIndent_2;
  Reader params;
  Reader call;
  Array<kj::StringTree> local_238;
  StringTree local_220;
  kj local_1e1;
  anon_class_32_4_977eede9 local_1e0;
  Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&> local_1c0;
  undefined1 local_1b8 [8];
  Array<kj::StringTree> encodedElements_1;
  StringPtr colon;
  undefined1 local_188 [3];
  bool childMultiline_1;
  uint subIndent_1;
  Reader object;
  Array<kj::StringTree> local_150;
  StringTree local_138;
  kj local_f9;
  anon_class_24_3_b5b61ab8 local_f8;
  Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&> local_e0;
  undefined1 local_d8 [8];
  Array<kj::StringTree> encodedElements;
  undefined1 local_b8 [3];
  bool childMultiline;
  uint subIndent;
  Reader array;
  String local_50;
  double local_38;
  bool local_2a;
  byte local_29;
  bool *pbStack_28;
  bool hasPrefix_local;
  bool *multiline_local;
  Impl *pIStack_18;
  uint indent_local;
  Impl *this_local;
  
  local_29 = hasPrefix;
  pbStack_28 = multiline;
  multiline_local._4_4_ = indent;
  pIStack_18 = this;
  this_local = (Impl *)__return_storage_ptr__;
  WVar2 = capnp::json::Value::Reader::which(&value);
  switch(WVar2) {
  case NULL_:
    kj::strTree<char_const(&)[5]>(__return_storage_ptr__,(kj *)"null",params_00);
    break;
  case BOOLEAN:
    local_2a = capnp::json::Value::Reader::getBoolean(&value);
    kj::strTree<bool>(__return_storage_ptr__,&local_2a);
    break;
  case NUMBER:
    local_38 = capnp::json::Value::Reader::getNumber(&value);
    kj::strTree<double>(__return_storage_ptr__,&local_38);
    break;
  case STRING:
    chars.content = (ArrayPtr<const_char>)capnp::json::Value::Reader::getString(&value);
    encodeString(&local_50,this,chars);
    kj::strTree<kj::String>(__return_storage_ptr__,&local_50);
    kj::String::~String(&local_50);
    break;
  case ARRAY:
    capnp::json::Value::Reader::getArray((Reader *)local_b8,&value);
    uVar1 = multiline_local._4_4_;
    uVar3 = List<capnp::json::Value,_(capnp::Kind)3>::Reader::size((Reader *)local_b8);
    encodedElements.disposer._4_4_ = (uVar1 + 1) - (uint)(uVar3 < 2);
    encodedElements.disposer._3_1_ = 0;
    kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::Mapper
              (&local_e0,(Reader *)local_b8);
    local_f8.subIndent = (uint *)((long)&encodedElements.disposer + 4);
    local_f8.childMultiline = (bool *)((long)&encodedElements.disposer + 3);
    local_f8.this = this;
    kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:63:32)>
              ((Array<kj::StringTree> *)local_d8,&local_e0,&local_f8);
    local_f9 = (kj)0x5b;
    pAVar4 = kj::mv<kj::Array<kj::StringTree>>((Array<kj::StringTree> *)local_d8);
    kj::Array<kj::StringTree>::Array(&local_150,pAVar4);
    pcVar5 = (char *)(ulong)multiline_local._4_4_;
    encodeList(&local_138,this,&local_150,(bool)(encodedElements.disposer._3_1_ & 1),
               multiline_local._4_4_,pbStack_28,(bool)(local_29 & 1));
    object.reader._47_1_ = 0x5d;
    kj::strTree<char,kj::StringTree,char>
              (__return_storage_ptr__,&local_f9,(char *)&local_138,
               (StringTree *)&object.reader.field_0x2f,pcVar5);
    kj::StringTree::~StringTree(&local_138);
    kj::Array<kj::StringTree>::~Array(&local_150);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_d8);
    break;
  case OBJECT:
    capnp::json::Value::Reader::getObject((Reader *)local_188,&value);
    uVar1 = multiline_local._4_4_;
    uVar3 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::size((Reader *)local_188);
    colon.content.size_._4_4_ = (uVar1 + 1) - (uint)(uVar3 < 2);
    colon.content.size_._3_1_ = 0;
    pcVar5 = ":";
    if ((this->prettyPrint & 1U) != 0) {
      pcVar5 = ": ";
    }
    kj::StringPtr::StringPtr((StringPtr *)&encodedElements_1.disposer,pcVar5);
    kj::_::Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&>::Mapper
              (&local_1c0,(Reader *)local_188);
    local_1e0.subIndent = (uint *)((long)&colon.content.size_ + 4);
    local_1e0.childMultiline = (bool *)((long)&colon.content.size_ + 3);
    local_1e0.this = this;
    local_1e0.colon = (StringPtr *)&encodedElements_1.disposer;
    kj::_::Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:76:32)>
              ((Array<kj::StringTree> *)local_1b8,&local_1c0,&local_1e0);
    local_1e1 = (kj)0x7b;
    pAVar4 = kj::mv<kj::Array<kj::StringTree>>((Array<kj::StringTree> *)local_1b8);
    kj::Array<kj::StringTree>::Array(&local_238,pAVar4);
    pcVar5 = (char *)(ulong)multiline_local._4_4_;
    encodeList(&local_220,this,&local_238,(bool)(colon.content.size_._3_1_ & 1),
               multiline_local._4_4_,pbStack_28,(bool)(local_29 & 1));
    call._reader._47_1_ = 0x7d;
    kj::strTree<char,kj::StringTree,char>
              (__return_storage_ptr__,&local_1e1,(char *)&local_220,
               (StringTree *)&call._reader.field_0x2f,pcVar5);
    kj::StringTree::~StringTree(&local_220);
    kj::Array<kj::StringTree>::~Array(&local_238);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_1b8);
    break;
  case CALL:
    __return_storage_ptr___00 = &params.reader.nestingLimit;
    capnp::json::Value::Reader::getCall((Reader *)__return_storage_ptr___00,&value);
    capnp::json::Value::Call::Reader::getParams
              ((Reader *)local_2a0,(Reader *)__return_storage_ptr___00);
    uVar1 = multiline_local._4_4_;
    uVar3 = List<capnp::json::Value,_(capnp::Kind)3>::Reader::size((Reader *)local_2a0);
    encodedElements_2.disposer._4_4_ = (uVar1 + 1) - (uint)(uVar3 < 2);
    encodedElements_2.disposer._3_1_ = 0;
    kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::Mapper
              (&local_2c8,(Reader *)local_2a0);
    local_2e0.subIndent = (uint *)((long)&encodedElements_2.disposer + 4);
    local_2e0.childMultiline = (bool *)((long)&encodedElements_2.disposer + 3);
    local_2e0.this = this;
    kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:91:32)>
              ((Array<kj::StringTree> *)local_2c0,&local_2c8,&local_2e0);
    local_2f0 = (ArrayPtr<const_char>)
                capnp::json::Value::Call::Reader::getFunction((Reader *)__return_storage_ptr___00);
    local_2f1 = 0x28;
    pAVar4 = kj::mv<kj::Array<kj::StringTree>>((Array<kj::StringTree> *)local_2c0);
    kj::Array<kj::StringTree>::Array(&local_348,pAVar4);
    params_3 = pbStack_28;
    encodeList(&local_330,this,&local_348,(bool)(encodedElements_2.disposer._3_1_ & 1),
               multiline_local._4_4_,pbStack_28,true);
    f.exception._7_1_ = 0x29;
    kj::strTree<capnp::Text::Reader,char,kj::StringTree,char>
              (__return_storage_ptr__,(kj *)&local_2f0,(Reader *)&local_2f1,(char *)&local_330,
               (StringTree *)((long)&f.exception + 7),params_3);
    kj::StringTree::~StringTree(&local_330);
    kj::Array<kj::StringTree>::~Array(&local_348);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_2c0);
    break;
  default:
    WVar2 = capnp::json::Value::Reader::which(&value);
    local_35c = (uint)WVar2;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],unsigned_int>
              (&local_358,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,100,FAILED,(char *)0x0,
               "\"unknown JsonValue type\", static_cast<uint>(value.which())",
               (char (*) [23])"unknown JsonValue type",&local_35c);
    kj::_::Debug::Fault::fatal(&local_358);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree encodeRaw(JsonValue::Reader value, uint indent, bool& multiline,
                           bool hasPrefix) const {
    switch (value.which()) {
      case JsonValue::NULL_:
        return kj::strTree("null");
      case JsonValue::BOOLEAN:
        return kj::strTree(value.getBoolean());
      case JsonValue::NUMBER:
        return kj::strTree(value.getNumber());

      case JsonValue::STRING:
        return kj::strTree(encodeString(value.getString()));

      case JsonValue::ARRAY: {
        auto array = value.getArray();
        uint subIndent = indent + (array.size() > 1);
        bool childMultiline = false;
        auto encodedElements = KJ_MAP(element, array) {
          return encodeRaw(element, subIndent, childMultiline, false);
        };

        return kj::strTree('[', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, hasPrefix), ']');
      }

      case JsonValue::OBJECT: {
        auto object = value.getObject();
        uint subIndent = indent + (object.size() > 1);
        bool childMultiline = false;
        kj::StringPtr colon = prettyPrint ? ": " : ":";
        auto encodedElements = KJ_MAP(field, object) {
          return kj::strTree(
              encodeString(field.getName()), colon,
              encodeRaw(field.getValue(), subIndent, childMultiline, true));
        };

        return kj::strTree('{', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, hasPrefix), '}');
      }

      case JsonValue::CALL: {
        auto call = value.getCall();
        auto params = call.getParams();
        uint subIndent = indent + (params.size() > 1);
        bool childMultiline = false;
        auto encodedElements = KJ_MAP(element, params) {
          return encodeRaw(element, subIndent, childMultiline, false);
        };

        return kj::strTree(call.getFunction(), '(', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, true), ')');
      }
    }

    KJ_FAIL_ASSERT("unknown JsonValue type", static_cast<uint>(value.which()));
  }